

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

ParserResult * __thiscall
Catch::clara::detail::
BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ricab[P]scope_guard/build_O2/_deps/catch2-src/single_include/catch2/catch.hpp:9745:33)>
::setValue(ParserResult *__return_storage_ptr__,
          BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ricab[P]scope_guard_build_O2__deps_catch2_src_single_include_catch2_catch_hpp:9745:33)>
          *this,string *arg)

{
  bool bVar1;
  time_t tVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> temp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  BasicResult<Catch::clara::detail::ParseResultType> local_48;
  
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  ::std::__cxx11::string::_M_assign((string *)&local_68);
  local_48.m_errorMessage._M_dataplus._M_p = (pointer)&local_48.m_errorMessage.field_2;
  local_48.super_ResultValueBase<Catch::clara::detail::ParseResultType>.super_ResultBase.m_type = Ok
  ;
  local_48.super_ResultValueBase<Catch::clara::detail::ParseResultType>.super_ResultBase._12_4_ = 0;
  local_48.super_ResultValueBase<Catch::clara::detail::ParseResultType>.super_ResultBase.
  _vptr_ResultBase = (_func_int **)&PTR__BasicResult_001908b0;
  local_48.m_errorMessage._M_string_length = 0;
  local_48.m_errorMessage.field_2._M_local_buf[0] = '\0';
  bVar1 = ::std::operator!=(&local_68,"time");
  if (bVar1) {
    convertInto<unsigned_int>(__return_storage_ptr__,&local_68,&((this->m_lambda).config)->rngSeed);
  }
  else {
    tVar2 = time((time_t *)0x0);
    ((this->m_lambda).config)->rngSeed = (uint)tVar2;
    *(undefined8 *)
     &(__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseResultType>).
      super_ResultBase.m_type = 0;
    (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseResultType>).
    super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__BasicResult_001908b0;
    (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_errorMessage).field_2;
    (__return_storage_ptr__->m_errorMessage)._M_string_length = 0;
    (__return_storage_ptr__->m_errorMessage).field_2._M_local_buf[0] = '\0';
  }
  BasicResult<Catch::clara::detail::ParseResultType>::~BasicResult(&local_48);
  ::std::__cxx11::string::~string((string *)&local_68);
  return __return_storage_ptr__;
}

Assistant:

auto setValue( std::string const &arg ) -> ParserResult override {
            return invokeLambda<typename UnaryLambdaTraits<L>::ArgType>( m_lambda, arg );
        }